

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Unserialize<HashVerifier<DataStream>,char>
               (HashVerifier<DataStream> *is,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str)

{
  long lVar1;
  uint64_t uVar2;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = ReadCompactSize<HashVerifier<DataStream>>(is,true);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (str,uVar2 & 0xffffffff);
  if ((uVar2 & 0xffffffff) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    HashVerifier<DataStream>::read
              (is,(int)(str->_M_dataplus)._M_p,(void *)str->_M_string_length,in_RCX);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::basic_string<C>& str)
{
    unsigned int nSize = ReadCompactSize(is);
    str.resize(nSize);
    if (nSize != 0)
        is.read(MakeWritableByteSpan(str));
}